

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaMan.c
# Opt level: O2

int Pla_ManDist1NumTest(Pla_Man_t *p)

{
  uint uVar1;
  abctime aVar2;
  abctime aVar3;
  int level;
  
  aVar2 = Abc_Clock();
  uVar1 = Pla_ManDist1Num(p);
  level = 0x7cf70e;
  printf("Found %d pairs among %d cubes using cube pair enumeration.  ",(ulong)uVar1,
         (ulong)(uint)(p->vCubes).nSize);
  aVar3 = Abc_Clock();
  Abc_Print(level,"%s =","Time");
  Abc_Print(level,"%9.2f sec\n",(double)(aVar3 - aVar2) / 1000000.0);
  return 1;
}

Assistant:

int Pla_ManDist1NumTest( Pla_Man_t * p )
{
    abctime clk = Abc_Clock();
    int Count = Pla_ManDist1Num( p );
    printf( "Found %d pairs among %d cubes using cube pair enumeration.  ", Count, Pla_ManCubeNum(p) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return 1;
}